

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

bool Assimp::Blender::read<Assimp::Blender::MLoopCol>
               (Structure *s,MLoopCol *p,size_t cnt,FileDatabase *db)

{
  uchar *puVar1;
  bool bVar2;
  MLoopCol read;
  MLoopCol local_48;
  
  puVar1 = &p->r;
  while (bVar2 = cnt != 0, cnt = cnt - 1, bVar2) {
    local_48.super_ElemBase.dna_type = (char *)0x0;
    local_48.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0080ed48;
    Structure::Convert<Assimp::Blender::MLoopCol>(s,&local_48,db);
    *(char **)(puVar1 + -8) = local_48.super_ElemBase.dna_type;
    *(undefined4 *)puVar1 = local_48._16_4_;
    puVar1 = puVar1 + 0x18;
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }